

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int set_uid_option(mg_context *phys_ctx)

{
  __uid_t _Var1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  passwd *local_28;
  passwd *to_pw;
  char *run_as_user;
  uid_t curr_uid;
  int success;
  mg_context *phys_ctx_local;
  
  run_as_user._4_4_ = 0;
  if (phys_ctx != (mg_context *)0x0) {
    _Var1 = getuid();
    pcVar5 = (phys_ctx->dd).config[2];
    local_28 = (passwd *)0x0;
    if ((pcVar5 == (char *)0x0) || (local_28 = getpwnam(pcVar5), local_28 != (passwd *)0x0)) {
      if ((pcVar5 == (char *)0x0) || (_Var1 == local_28->pw_uid)) {
        run_as_user._4_4_ = 1;
      }
      else {
        iVar2 = setgid(local_28->pw_gid);
        if (iVar2 == -1) {
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          mg_cry_internal_wrap
                    ((mg_connection *)0x0,phys_ctx,"set_uid_option",0x3fa9,"%s: setgid(%s): %s",
                     "set_uid_option",pcVar5,pcVar4);
        }
        else {
          iVar2 = setgroups(0,(__gid_t *)0x0);
          if (iVar2 == -1) {
            piVar3 = __errno_location();
            pcVar5 = strerror(*piVar3);
            mg_cry_internal_wrap
                      ((mg_connection *)0x0,phys_ctx,"set_uid_option",0x3fae,"%s: setgroups(): %s",
                       "set_uid_option",pcVar5);
          }
          else {
            iVar2 = setuid(local_28->pw_uid);
            if (iVar2 == -1) {
              piVar3 = __errno_location();
              pcVar4 = strerror(*piVar3);
              mg_cry_internal_wrap
                        ((mg_connection *)0x0,phys_ctx,"set_uid_option",0x3fb4,"%s: setuid(%s): %s",
                         "set_uid_option",pcVar5,pcVar4);
            }
            run_as_user._4_4_ = (uint)(iVar2 != -1);
          }
        }
      }
    }
    else {
      mg_cry_internal_wrap
                ((mg_connection *)0x0,phys_ctx,"set_uid_option",0x3f9c,"%s: unknown user [%s]",
                 "set_uid_option",pcVar5);
    }
  }
  return run_as_user._4_4_;
}

Assistant:

static int
set_uid_option(struct mg_context *phys_ctx)
{
	int success = 0;

	if (phys_ctx) {
		/* We are currently running as curr_uid. */
		const uid_t curr_uid = getuid();
		/* If set, we want to run as run_as_user. */
		const char *run_as_user = phys_ctx->dd.config[RUN_AS_USER];
		const struct passwd *to_pw = NULL;

		if ((run_as_user != NULL) && (to_pw = getpwnam(run_as_user)) == NULL) {
			/* run_as_user does not exist on the system. We can't proceed
			 * further. */
			mg_cry_ctx_internal(phys_ctx,
			                    "%s: unknown user [%s]",
			                    __func__,
			                    run_as_user);
		} else if ((run_as_user == NULL) || (curr_uid == to_pw->pw_uid)) {
			/* There was either no request to change user, or we're already
			 * running as run_as_user. Nothing else to do.
			 */
			success = 1;
		} else {
			/* Valid change request.  */
			if (setgid(to_pw->pw_gid) == -1) {
				mg_cry_ctx_internal(phys_ctx,
				                    "%s: setgid(%s): %s",
				                    __func__,
				                    run_as_user,
				                    strerror(errno));
			} else if (setgroups(0, NULL) == -1) {
				mg_cry_ctx_internal(phys_ctx,
				                    "%s: setgroups(): %s",
				                    __func__,
				                    strerror(errno));
			} else if (setuid(to_pw->pw_uid) == -1) {
				mg_cry_ctx_internal(phys_ctx,
				                    "%s: setuid(%s): %s",
				                    __func__,
				                    run_as_user,
				                    strerror(errno));
			} else {
				success = 1;
			}
		}
	}

	return success;
}